

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Value * __thiscall
GlobOpt::CreateDstUntransferredValue
          (GlobOpt *this,ValueType desiredValueType,Instr *instr,Value *src1Value,Value *src2Value)

{
  code *pcVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 desiredValueType_00;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *pOVar4;
  Value *pVVar5;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  ValueType valueType;
  Value *src2Value_local;
  Value *src1Value_local;
  Instr *instr_local;
  GlobOpt *this_local;
  ValueType desiredValueType_local;
  
  this_local._6_2_ = desiredValueType.field_0;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x16ae,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOVar4 = IR::Instr::GetDst(instr);
  if (pOVar4 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x16af,"(instr->GetDst())","instr->GetDst()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = ValueType::IsInt((ValueType *)((long)&this_local + 6));
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x16b0,"(!desiredValueType.IsInt())","!desiredValueType.IsInt()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  desiredValueType_00 = this_local._6_2_;
  local_32.field_0 = this_local._6_2_;
  bVar2 = IsLoopPrePass(this);
  if (bVar2) {
    bVar2 = IsPrepassSrcValueInfoPrecise(this,instr,src1Value,src2Value,(bool *)0x0);
    local_32.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         GetPrepassValueTypeForDst
                   (this,desiredValueType_00.field_0,instr,src1Value,src2Value,bVar2,false);
  }
  pOVar4 = IR::Instr::GetDst(instr);
  pVVar5 = NewGenericValue(this,(ValueType)local_32.field_0,pOVar4);
  return pVVar5;
}

Assistant:

Value *
GlobOpt::CreateDstUntransferredValue(
    const ValueType desiredValueType,
    IR::Instr *const instr,
    Value *const src1Value,
    Value *const src2Value)
{
    Assert(instr);
    Assert(instr->GetDst());
    Assert(!desiredValueType.IsInt()); // use CreateDstUntransferredIntValue instead

    ValueType valueType(desiredValueType);
    if(IsLoopPrePass())
    {
        valueType = GetPrepassValueTypeForDst(valueType, instr, src1Value, src2Value, IsPrepassSrcValueInfoPrecise(instr, src1Value, src2Value));
    }
    return NewGenericValue(valueType, instr->GetDst());
}